

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v7::detail::
       parse_format_specs<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
                 *handler)

{
  basic_format_specs<char> *pbVar1;
  char cVar2;
  char *begin_00;
  byte bVar3;
  
  if (begin == end) {
    return begin;
  }
  begin_00 = parse_align<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                       (begin,end,handler);
  if (begin_00 == end) {
    return begin_00;
  }
  cVar2 = *begin_00;
  if (cVar2 == ' ') {
    bVar3 = 0x30;
  }
  else if (cVar2 == '+') {
    bVar3 = 0x20;
  }
  else {
    if (cVar2 != '-') goto LAB_00124284;
    bVar3 = 0x10;
  }
  numeric_specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
  ::check_sign(&handler->checker_);
  pbVar1 = (handler->
           super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
           ).super_specs_setter<char>.specs_;
  begin_00 = begin_00 + 1;
  pbVar1->field_0x9 = pbVar1->field_0x9 & 0x8f | bVar3;
LAB_00124284:
  if (begin_00 != end) {
    cVar2 = *begin_00;
    if (cVar2 == '#') {
      specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
      ::on_hash(handler);
      begin_00 = begin_00 + 1;
      if (begin_00 == end) {
        return begin_00;
      }
      cVar2 = *begin_00;
    }
    if (cVar2 == '0') {
      specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_>
      ::on_zero(handler);
      begin_00 = begin_00 + 1;
      if (begin_00 == end) {
        return begin_00;
      }
    }
    begin_00 = parse_width<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                         (begin_00,end,handler);
    if (begin_00 != end) {
      if (*begin_00 == '.') {
        begin_00 = parse_precision<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>>&>
                             (begin_00,end,handler);
      }
      if ((begin_00 != end) && (cVar2 = *begin_00, cVar2 != '}')) {
        begin_00 = begin_00 + 1;
        ((handler->
         super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
         ).super_specs_setter<char>.specs_)->type = cVar2;
      }
    }
  }
  return begin_00;
}

Assistant:

FMT_CONSTEXPR const Char* parse_format_specs(const Char* begin, const Char* end,
                                             SpecHandler&& handler) {
  if (begin == end) return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (to_ascii(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    begin = parse_precision(begin, end, handler);
  }

  // Parse type.
  if (begin != end && *begin != '}') handler.on_type(*begin++);
  return begin;
}